

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O2

void __thiscall
Js::PolymorphicInlineCache::CopyTo
          (PolymorphicInlineCache *this,PropertyId propertyId,ScriptContext *scriptContext,
          PolymorphicInlineCache *clone)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *type;
  InlineCache *this_00;
  long lVar5;
  uint inlineCacheIndex;
  ulong uVar6;
  ulong uVar7;
  
  if (clone == (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x36d,"(clone)","clone");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  clone->ignoreForEquivalentObjTypeSpec = this->ignoreForEquivalentObjTypeSpec;
  clone->cloneForJitTimeUse = this->cloneForJitTimeUse;
  lVar5 = 0;
  for (uVar7 = 0; uVar7 < this->size; uVar7 = uVar7 + 1) {
    type = InlineCache::GetType((InlineCache *)((long)&this->inlineCaches->u + lVar5));
    if (type != (Type *)0x0) {
      uVar6 = (ulong)clone->size + 0xffffffff & (ulong)type >> 6;
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01441eb0,CloneCacheInCollisionPhase);
      inlineCacheIndex = (uint)uVar6;
      if (!bVar3) {
        pTVar1 = clone->inlineCaches[uVar6 & 0xffffffff].u.local.type;
        if (pTVar1 != (Type *)0x0) {
          this_00 = clone->inlineCaches + (uVar6 & 0xffffffff);
          bVar3 = InlineCache::NeedsToBeRegisteredForStoreFieldInvalidation(this_00);
          if ((!bVar3) && (this->size != 1)) {
            if ((undefined1  [24])((undefined1  [24])this_00->u & (undefined1  [24])0x1) ==
                (undefined1  [24])0x0) {
              if (((ulong)pTVar1 & 1) == 0) {
                CloneInlineCacheToEmptySlotInCollision<false,false,true>
                          (clone,type,inlineCacheIndex);
              }
              else {
                CloneInlineCacheToEmptySlotInCollision<false,true,false>
                          (clone,type,inlineCacheIndex);
              }
            }
            else {
              CloneInlineCacheToEmptySlotInCollision<true,false,false>(clone,type,inlineCacheIndex);
            }
          }
        }
      }
      InlineCache::CopyTo((InlineCache *)((long)&this->inlineCaches->u + lVar5),propertyId,
                          scriptContext,clone->inlineCaches + (uVar6 & 0xffffffff));
      UpdateInlineCachesFillInfo(clone,inlineCacheIndex,true);
    }
    lVar5 = lVar5 + 0x20;
  }
  return;
}

Assistant:

void PolymorphicInlineCache::CopyTo(PropertyId propertyId, ScriptContext* scriptContext, PolymorphicInlineCache *const clone)
    {
        Assert(clone);

        clone->ignoreForEquivalentObjTypeSpec = this->ignoreForEquivalentObjTypeSpec;
        clone->cloneForJitTimeUse = this->cloneForJitTimeUse;

        for (uint i = 0; i < GetSize(); ++i)
        {
            Type * type = inlineCaches[i].GetType();
            if (type)
            {
                uint inlineCacheIndex = clone->GetInlineCacheIndexForType(type);

                // When copying inline caches from one polymorphic cache to another, types are again hashed to get the corresponding indices in the new polymorphic cache.
                // This might lead to collision in the new cache. We need to try to resolve that collision.
                if (!PHASE_OFF1(Js::CloneCacheInCollisionPhase))
                {
                    if (!clone->inlineCaches[inlineCacheIndex].IsEmpty() && !clone->inlineCaches[inlineCacheIndex].NeedsToBeRegisteredForStoreFieldInvalidation() && GetSize() != 1)
                    {
                        if (clone->inlineCaches[inlineCacheIndex].IsLocal())
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<true, false, false>(type, inlineCacheIndex);
                        }
                        else if (clone->inlineCaches[inlineCacheIndex].IsProto())
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<false, true, false>(type, inlineCacheIndex);
                        }
                        else
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<false, false, true>(type, inlineCacheIndex);
                        }

                    }
                }
                inlineCaches[i].CopyTo(propertyId, scriptContext, &clone->inlineCaches[inlineCacheIndex]);
                clone->UpdateInlineCachesFillInfo(inlineCacheIndex, true /*set*/);
            }
        }
    }